

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonEx(char *label,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  ImGuiID id;
  bool bVar3;
  bool bVar4;
  ImU32 fill_col;
  int iVar5;
  int idx;
  float fVar6;
  float fVar7;
  bool held;
  bool hovered;
  ImGuiID local_7c;
  ImRect bb;
  ImVec2 label_size;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 size;
  
  pIVar2 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_7c = ImGuiWindow::GetID(this,label,(char *)0x0);
    label_size = CalcTextSize(label,(char *)0x0,true,-1.0);
    bb.Min.x = (this->DC).CursorPos.x;
    bb.Min.y = (this->DC).CursorPos.y;
    fVar6 = (pIVar2->Style).FramePadding.y;
    if (((short)flags < 0) && (fVar7 = (this->DC).CurrLineTextBaseOffset, fVar6 < fVar7)) {
      bb.Min.y = bb.Min.y + (fVar7 - fVar6);
    }
    fVar7 = (pIVar2->Style).FramePadding.x;
    size = CalcItemSize(*size_arg,fVar7 + fVar7 + label_size.x,fVar6 + fVar6 + label_size.y);
    bb.Max.x = bb.Min.x + size.x;
    bb.Max.y = bb.Min.y + size.y;
    ItemSize(&size,(pIVar2->Style).FramePadding.y);
    id = local_7c;
    bVar4 = false;
    bVar3 = ItemAdd(&bb,local_7c,(ImRect *)0x0,0);
    if (bVar3) {
      bVar4 = ButtonBehavior(&bb,id,&hovered,&held,
                             ((pIVar2->LastItemData).InFlags & 2U) << 9 | flags);
      iVar5 = ((held ^ 1U) & hovered) + 0x15;
      idx = 0x17;
      if ((hovered & 1U) == 0) {
        idx = iVar5;
      }
      if (held == false) {
        idx = iVar5;
      }
      fill_col = GetColorU32(idx,1.0);
      RenderNavHighlight(&bb,id,1);
      IVar1.y = bb.Min.y;
      IVar1.x = bb.Min.x;
      RenderFrame(IVar1,bb.Max,fill_col,true,(pIVar2->Style).FrameRounding);
      if (pIVar2->LogEnabled == true) {
        LogSetNextTextDecoration("[","]");
      }
      IVar1 = (pIVar2->Style).FramePadding;
      fVar6 = IVar1.x;
      local_40.x = bb.Min.x + fVar6;
      fVar7 = IVar1.y;
      local_40.y = bb.Min.y + fVar7;
      local_48.x = bb.Max.x - fVar6;
      local_48.y = bb.Max.y - fVar7;
      RenderTextClipped(&local_40,&local_48,label,(char *)0x0,&label_size,
                        &(pIVar2->Style).ButtonTextAlign,&bb);
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}